

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::WebSocketImpl::ZlibContext::ZlibContext
          (ZlibContext *this,Mode mode,CompressionParameters *config)

{
  bool bVar1;
  unsigned_long *puVar2;
  undefined8 in_stack_ffffffffffffff10;
  undefined4 uVar3;
  Fault local_d8;
  Fault f_1;
  int *local_c8;
  undefined1 local_c0 [8];
  DebugComparison<int_&,_int> _kjCondition_1;
  unsigned_long uStack_90;
  int result_1;
  int local_88;
  int windowBits_1;
  Fault local_78;
  Fault f;
  int *local_68;
  undefined1 local_60 [8];
  DebugComparison<int_&,_int> _kjCondition;
  unsigned_long uStack_30;
  int result;
  int local_24;
  CompressionParameters *pCStack_20;
  int windowBits;
  CompressionParameters *config_local;
  ZlibContext *pZStack_10;
  Mode mode_local;
  ZlibContext *this_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  this->mode = mode;
  (this->ctx).next_in = (Bytef *)0x0;
  (this->ctx).avail_in = 0;
  (this->ctx).total_in = 0;
  (this->ctx).next_out = (Bytef *)0x0;
  (this->ctx).avail_out = 0;
  (this->ctx).total_out = 0;
  (this->ctx).msg = (char *)0x0;
  (this->ctx).state = (internal_state *)0x0;
  (this->ctx).zalloc = (alloc_func)0x0;
  (this->ctx).zfree = (free_func)0x0;
  (this->ctx).opaque = (voidpf)0x0;
  (this->ctx).data_type = 0;
  (this->ctx).adler = 0;
  (this->ctx).reserved = 0;
  pCStack_20 = config;
  config_local._4_4_ = mode;
  pZStack_10 = this;
  if (mode == COMPRESS) {
    uStack_30 = 0xf;
    puVar2 = Maybe<unsigned_long>::orDefault
                       (&config->outboundMaxWindowBits,&stack0xffffffffffffffd0);
    local_24 = -(int)*puVar2;
    if (local_24 == -8) {
      local_24 = -9;
    }
    _kjCondition._36_4_ =
         deflateInit2_(&this->ctx,0xffffffff,8,local_24,8,0,"1.2.11",CONCAT44(uVar3,0x70));
    local_68 = (int *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                 (int *)&_kjCondition.field_0x24);
    f.exception._4_4_ = 0;
    kj::_::DebugExpression<int&>::operator==
              ((DebugComparison<int_&,_int> *)local_60,(DebugExpression<int&> *)&local_68,
               (int *)((long)&f.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[52]>
                (&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xcb6,FAILED,"result == Z_OK",
                 "_kjCondition,\"Failed to initialize compression context (deflate).\"",
                 (DebugComparison<int_&,_int> *)local_60,
                 (char (*) [52])"Failed to initialize compression context (deflate).");
      kj::_::Debug::Fault::fatal(&local_78);
    }
  }
  else if (mode == DECOMPRESS) {
    uStack_90 = 0xf;
    puVar2 = Maybe<unsigned_long>::orDefault(&config->inboundMaxWindowBits,&stack0xffffffffffffff70)
    ;
    local_88 = -(int)*puVar2;
    _kjCondition_1._36_4_ = inflateInit2_(&this->ctx,local_88,"1.2.11");
    local_c8 = (int *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                 (int *)&_kjCondition_1.field_0x24);
    f_1.exception._4_4_ = 0;
    kj::_::DebugExpression<int&>::operator==
              ((DebugComparison<int_&,_int> *)local_c0,(DebugExpression<int&> *)&local_c8,
               (int *)((long)&f_1.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c0);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[54]>
                (&local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xcbd,FAILED,"result == Z_OK",
                 "_kjCondition,\"Failed to initialize decompression context (inflate).\"",
                 (DebugComparison<int_&,_int> *)local_c0,
                 (char (*) [54])"Failed to initialize decompression context (inflate).");
      kj::_::Debug::Fault::fatal(&local_d8);
    }
  }
  return;
}

Assistant:

ZlibContext(Mode mode, const CompressionParameters& config) : mode(mode) {
      switch (mode) {
        case Mode::COMPRESS: {
          int windowBits = -config.outboundMaxWindowBits.orDefault(15);
          // We use negative values because we want to use raw deflate.
          if(windowBits == -8) {
            // Zlib cannot accept `windowBits` of 8 for the deflater. However, due to an
            // implementation quirk, `windowBits` of 8 and 9 would both use 250 bytes.
            // Therefore, a decompressor using `windowBits` of 8 could safely inflate a message
            // that a zlib client compressed using `windowBits` = 9.
            // https://bugs.chromium.org/p/chromium/issues/detail?id=691074
            windowBits = -9;
          }
          int result = deflateInit2(
              &ctx,
              Z_DEFAULT_COMPRESSION,
              Z_DEFLATED,
              windowBits,
              8,  // memLevel = 8 is the default
              Z_DEFAULT_STRATEGY);
          KJ_REQUIRE(result == Z_OK, "Failed to initialize compression context (deflate).");
          break;
        }
        case Mode::DECOMPRESS: {
          int windowBits = -config.inboundMaxWindowBits.orDefault(15);
          // We use negative values because we want to use raw inflate.
          int result = inflateInit2(&ctx, windowBits);
          KJ_REQUIRE(result == Z_OK, "Failed to initialize decompression context (inflate).");
          break;
        }
      }
    }